

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

int __thiscall
cxxopts::values::standard_value<int>::clone
          (standard_value<int> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<cxxopts::values::standard_value<int>_> *in_stack_ffffffffffffffc8;
  standard_value<int> *this_00;
  
  this_00 = this;
  std::make_shared<cxxopts::values::standard_value<int>,cxxopts::values::standard_value<int>const&>
            (this);
  std::shared_ptr<cxxopts::Value>::shared_ptr<cxxopts::values::standard_value<int>,void>
            ((shared_ptr<cxxopts::Value> *)this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<cxxopts::values::standard_value<int>_>::~shared_ptr
            ((shared_ptr<cxxopts::values::standard_value<int>_> *)0x178273);
  return (int)this;
}

Assistant:

std::shared_ptr<Value>
            clone() const
            {
                return std::make_shared<standard_value<T>>(*this);
            }